

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

void pmswinc_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  uint64_t *puVar1;
  byte counter;
  _Bool _Var2;
  uint uVar3;
  uint64_t uVar4;
  ulong uVar5;
  
  uVar4 = (env->cp15).c9_pmcr;
  if ((uVar4 & 0xf800) != 0) {
    uVar5 = 0;
    do {
      counter = (byte)uVar5;
      if ((value >> (uVar5 & 0x3f) & 1) != 0) {
        _Var2 = pmu_counter_enabled(env,counter);
        if ((_Var2) && ((short)(env->cp15).c14_pmevtyper[uVar5] == 0)) {
          pmevcntr_op_start(env,counter);
          uVar3 = (uint)(env->cp15).c14_pmevcntr[uVar5];
          if ((int)(-uVar3 - 2 & uVar3) < 0) {
            puVar1 = &(env->cp15).c9_pmovsr;
            *puVar1 = *puVar1 | 1L << (counter & 0x3f);
          }
          (env->cp15).c14_pmevcntr[uVar5] = (ulong)(uVar3 + 1);
          uVar4 = (env->cp15).c9_pmcr;
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < ((uint)(uVar4 >> 0xb) & 0x1f));
  }
  return;
}

Assistant:

static void pmswinc_write(CPUARMState *env, const ARMCPRegInfo *ri,
                          uint64_t value)
{
    unsigned int i;
    for (i = 0; i < pmu_num_counters(env); i++) {
        /* Increment a counter's count iff: */
        if ((value & (1ULL << i)) && /* counter's bit is set */
                /* counter is enabled and not filtered */
                pmu_counter_enabled(env, i) &&
                /* counter is SW_INCR */
                (env->cp15.c14_pmevtyper[i] & PMXEVTYPER_EVTCOUNT) == 0x0) {
            pmevcntr_op_start(env, i);

            /*
             * Detect if this write causes an overflow since we can't predict
             * PMSWINC overflows like we can for other events
             */
            uint32_t new_pmswinc = env->cp15.c14_pmevcntr[i] + 1;

            if (env->cp15.c14_pmevcntr[i] & ~new_pmswinc & INT32_MIN) {
                env->cp15.c9_pmovsr |= (1ULL << i);
            }

            env->cp15.c14_pmevcntr[i] = new_pmswinc;

            pmevcntr_op_finish(env, i);
        }
    }
}